

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::checkProgramStageiv
          (FunctionalTest3_4 *this,GLuint program_id,GLenum pname,GLint expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  GLchar *local_1d0 [3];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLint value;
  Functions *gl;
  GLenum local_20;
  GLint expected_local;
  GLenum pname_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  gl._4_4_ = expected;
  local_20 = pname;
  expected_local = program_id;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = 0;
  (**(code **)(lStack_30 + 0x9d0))(expected_local,0x8b31,local_20,&local_34);
  err = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(err,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xbe9);
  bVar4 = gl._4_4_ == local_34;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [53])"Error. Invalid result. Function: getProgramStageiv. ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2a69541);
    local_1d0[0] = Utils::pnameToStr(local_20);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])0x2a1a406);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b17bfb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2b01f60);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool FunctionalTest3_4::checkProgramStageiv(glw::GLuint program_id, glw::GLenum pname, glw::GLint expected) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLint				  value = 0;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	if (expected != value)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Function: getProgramStageiv. "
											<< "pname: " << Utils::pnameToStr(pname) << ". "
											<< "Result: " << value << ". "
											<< "Expected: " << expected << "." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}